

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O2

void xemmai::t_signature<long,int>::f_check<0ul,1ul>(undefined8 *a_stack)

{
  f_check<long>((t_object *)*a_stack,L"argument0");
  f_check<int>((t_object *)a_stack[2],L"argument1");
  return;
}

Assistant:

static void f_check(t_pvalue* a_stack, std::index_sequence<A_i...>)
	{
		(xemmai::f_check<T_an>(a_stack[A_i], t_cs<L'a', L'r', L'g', L'u', L'm', L'e', L'n', L't'>() + typename t_n2s<A_i>::t()), ...);
	}